

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scattering.h
# Opt level: O3

Float __thiscall
pbrt::TrowbridgeReitzDistribution::PDF(TrowbridgeReitzDistribution *this,Vector3f wo,Vector3f wm)

{
  float fVar1;
  undefined1 auVar2 [16];
  float fVar3;
  ulong uVar4;
  undefined8 uVar5;
  bool bVar6;
  byte bVar7;
  undefined1 auVar8 [16];
  float fVar9;
  Float FVar10;
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  float fVar13;
  undefined4 in_XMM3_Db;
  undefined4 in_XMM3_Dd;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  float fVar16;
  float fVar17;
  Tuple3<pbrt::Vector3,_float> local_38;
  undefined1 local_28 [16];
  float local_18;
  undefined4 uStack_14;
  undefined4 uStack_10;
  undefined4 uStack_c;
  
  local_18 = wm.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar12._8_56_ = wm._8_56_;
  auVar12._0_8_ = wm.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  local_38.z = wo.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar11._8_56_ = wo._8_56_;
  auVar11._0_8_ = wo.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  local_38._0_8_ = vmovlps_avx(auVar11._0_16_);
  fVar3 = local_18 * local_18;
  fVar16 = 0.0;
  uStack_10 = 0;
  auVar14 = vmaxss_avx(ZEXT416((uint)(1.0 - fVar3)),ZEXT816(0) << 0x40);
  fVar9 = auVar14._0_4_ / fVar3;
  local_28 = auVar12._0_16_;
  if ((ABS(fVar9) != INFINITY) && (1e-16 <= fVar3 * fVar3)) {
    auVar14 = vsqrtss_avx(auVar14,auVar14);
    fVar16 = 0.0;
    if ((auVar14._0_4_ != 0.0) || (NAN(auVar14._0_4_))) {
      auVar14._4_4_ = auVar14._0_4_;
      auVar14._8_4_ = auVar14._0_4_;
      auVar14._12_4_ = auVar14._0_4_;
      fVar17 = this->alpha_x;
      auVar14 = vdivps_avx(local_28,auVar14);
      auVar2._8_4_ = 0x3f800000;
      auVar2._0_8_ = 0x3f8000003f800000;
      auVar2._12_4_ = 0x3f800000;
      uVar4 = vcmpps_avx512vl(auVar14,auVar2,0xe);
      uVar5 = vcmpss_avx512f(auVar14,SUB6416(ZEXT464(0xbf800000),0),1);
      bVar6 = (bool)((byte)uVar5 & 1);
      auVar2 = vmovshdup_avx(auVar14);
      bVar7 = (byte)(uVar4 >> 1);
      fVar16 = (float)((uint)bVar6 * -0x40800000 +
                      (uint)!bVar6 *
                      ((uint)((byte)uVar4 & 1) * 0x3f800000 +
                      (uint)!(bool)((byte)uVar4 & 1) * auVar14._0_4_));
      uVar5 = vcmpss_avx512f(auVar2,SUB6416(ZEXT464(0xbf800000),0),1);
      bVar6 = (bool)((byte)uVar5 & 1);
      fVar13 = (fVar16 * fVar16) / (fVar17 * fVar17);
      fVar16 = (float)((uint)bVar6 * -0x40800000 +
                      (uint)!bVar6 *
                      ((uint)(bVar7 & 1) * 0x3f800000 + (uint)!(bool)(bVar7 & 1) * auVar2._0_4_));
    }
    else {
      fVar17 = this->alpha_x;
      fVar13 = 1.0 / (fVar17 * fVar17);
    }
    fVar1 = this->alpha_y;
    fVar16 = fVar9 * (fVar13 + (fVar16 * fVar16) / (fVar1 * fVar1)) + 1.0;
    fVar16 = 1.0 / (fVar3 * fVar3 * fVar17 * 3.1415927 * fVar1 * fVar16 * fVar16);
  }
  uStack_14 = in_XMM3_Db;
  uStack_c = in_XMM3_Dd;
  FVar10 = Lambda(this,(Vector3f *)&local_38);
  auVar8._4_4_ = uStack_14;
  auVar8._0_4_ = local_18;
  auVar8._8_4_ = uStack_10;
  auVar8._12_4_ = uStack_c;
  auVar15._8_4_ = 0x7fffffff;
  auVar15._0_8_ = 0x7fffffff7fffffff;
  auVar15._12_4_ = 0x7fffffff;
  auVar14 = vmovshdup_avx(local_28);
  auVar14 = vfmadd231ss_fma(ZEXT416((uint)(auVar14._0_4_ * local_38.y)),local_28,
                            ZEXT416((uint)local_38.x));
  auVar14 = vfmadd213ss_fma(auVar8,ZEXT416((uint)local_38.z),auVar14);
  auVar14 = vandps_avx(auVar14,auVar15);
  auVar2 = vandps_avx(ZEXT416((uint)local_38.z),auVar15);
  return ((1.0 / (FVar10 + 1.0)) * fVar16 * auVar14._0_4_) / auVar2._0_4_;
}

Assistant:

PBRT_CPU_GPU
    Float PDF(Vector3f wo, Vector3f wm) const {
        return D(wm) * G1(wo) * AbsDot(wo, wm) / AbsCosTheta(wo);
    }